

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

float nk_widget_width(nk_context *ctx)

{
  nk_rect bounds;
  nk_rect nStack_18;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4a6a,"float nk_widget_width(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    nk_layout_peek(&nStack_18,ctx);
    return nStack_18.w;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x4a6b,"float nk_widget_width(struct nk_context *)");
}

Assistant:

NK_API float
nk_widget_width(struct nk_context *ctx)
{
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return 0;

    nk_layout_peek(&bounds, ctx);
    return bounds.w;
}